

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryWriter::writeToPath
          (BinaryRegistryWriter *this,string *dstPath)

{
  pointer *__return_storage_ptr__;
  bool bVar1;
  byte bVar2;
  BinarySlot *pBVar3;
  char *pcVar4;
  size_type numEntries;
  InternalError *this_00;
  reference pvVar5;
  ProgramIdentifierIndex *local_3e0;
  allocator<char> local_391;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  char local_350 [8];
  ofstream indexOut;
  string local_150;
  string local_130;
  FilePath local_110;
  undefined1 local_f0 [8];
  vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  index;
  undefined1 local_b8 [8];
  FilePath indexPath;
  undefined1 local_78 [8];
  string progPath;
  BinarySlot *slot;
  size_t binaryNdx;
  FilePath local_38;
  string *local_18;
  string *dstPath_local;
  BinaryRegistryWriter *this_local;
  
  local_18 = dstPath;
  dstPath_local = (string *)this;
  de::FilePath::FilePath(&local_38,dstPath);
  bVar1 = de::FilePath::exists(&local_38);
  de::FilePath::~FilePath(&local_38);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    de::createDirectoryAndParents(pcVar4);
  }
  for (slot = (BinarySlot *)0x0;
      pBVar3 = (BinarySlot *)
               std::
               vector<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
               ::size(&this->m_binaries), slot < pBVar3;
      slot = (BinarySlot *)((long)&slot->binary + 1)) {
    progPath.field_2._8_8_ =
         std::
         vector<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
         ::operator[](&this->m_binaries,(size_type)slot);
    if (((const_reference)progPath.field_2._8_8_)->referenceCount == 0) {
      anon_unknown_8::getProgramPath((string *)local_78,local_18,(deUint32)slot);
      de::FilePath::FilePath((FilePath *)((long)&indexPath.m_path.field_2 + 8),(string *)local_78);
      bVar1 = de::FilePath::exists((FilePath *)((long)&indexPath.m_path.field_2 + 8));
      de::FilePath::~FilePath((FilePath *)((long)&indexPath.m_path.field_2 + 8));
      if (bVar1) {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        deDeleteFile(pcVar4);
      }
      std::__cxx11::string::~string((string *)local_78);
    }
    else {
      anon_unknown_8::writeBinary
                (local_18,(deUint32)slot,((const_reference)progPath.field_2._8_8_)->binary);
    }
  }
  __return_storage_ptr__ =
       &index.
        super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  anon_unknown_8::getIndexPath((string *)__return_storage_ptr__,local_18);
  de::FilePath::FilePath((FilePath *)local_b8,(string *)__return_storage_ptr__);
  std::__cxx11::string::~string
            ((string *)
             &index.
              super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  ::vector((vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
            *)local_f0);
  numEntries = std::
               vector<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
               ::size(&this->m_binaryIndices);
  bVar1 = std::
          vector<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
          ::empty(&this->m_binaryIndices);
  if (bVar1) {
    local_3e0 = (ProgramIdentifierIndex *)0x0;
  }
  else {
    local_3e0 = std::
                vector<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
                ::operator[](&this->m_binaryIndices,0);
  }
  anon_unknown_8::buildBinaryIndex
            ((vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
              *)local_f0,numEntries,local_3e0);
  de::FilePath::getDirName_abi_cxx11_(&local_130,(FilePath *)local_b8);
  de::FilePath::FilePath(&local_110,&local_130);
  bVar1 = de::FilePath::exists(&local_110);
  de::FilePath::~FilePath(&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    de::FilePath::getDirName_abi_cxx11_(&local_150,(FilePath *)local_b8);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    de::createDirectoryAndParents(pcVar4);
    std::__cxx11::string::~string((string *)&local_150);
  }
  pcVar4 = de::FilePath::getPath((FilePath *)local_b8);
  std::ofstream::ofstream(local_350,pcVar4,_S_bin);
  bVar2 = std::ofstream::is_open();
  if (((bVar2 & 1) != 0) && (bVar2 = std::ios::good(), (bVar2 & 1) != 0)) {
    pvVar5 = std::
             vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
             ::operator[]((vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                           *)local_f0,0);
    std::
    vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
    ::size((vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
            *)local_f0);
    std::ostream::write(local_350,(long)pvVar5);
    std::ofstream::~ofstream(local_350);
    std::
    vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
    ::~vector((vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
               *)local_f0);
    de::FilePath::~FilePath((FilePath *)local_b8);
    return;
  }
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"Failed to open program binary index file ",&local_391);
  pcVar4 = de::FilePath::getPath((FilePath *)local_b8);
  std::operator+(&local_370,&local_390,pcVar4);
  tcu::InternalError::InternalError(this_00,&local_370);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
}

Assistant:

void BinaryRegistryWriter::writeToPath (const std::string& dstPath) const
{
	if (!de::FilePath(dstPath).exists())
		de::createDirectoryAndParents(dstPath.c_str());

	DE_ASSERT(m_binaries.size() <= 0xffffffffu);
	for (size_t binaryNdx = 0; binaryNdx < m_binaries.size(); ++binaryNdx)
	{
		const BinarySlot&	slot	= m_binaries[binaryNdx];

		if (slot.referenceCount > 0)
		{
			DE_ASSERT(slot.binary);
			writeBinary(dstPath, (deUint32)binaryNdx, *slot.binary);
		}
		else
		{
			// Delete stale binary if such exists
			const std::string	progPath	= getProgramPath(dstPath, (deUint32)binaryNdx);

			if (de::FilePath(progPath).exists())
				deDeleteFile(progPath.c_str());
		}

	}

	// Write index
	{
		const de::FilePath				indexPath	= getIndexPath(dstPath);
		std::vector<BinaryIndexNode>	index;

		buildBinaryIndex(&index, m_binaryIndices.size(), !m_binaryIndices.empty() ? &m_binaryIndices[0] : DE_NULL);

		// Even in empty index there is always terminating node for the root group
		DE_ASSERT(!index.empty());

		if (!de::FilePath(indexPath.getDirName()).exists())
			de::createDirectoryAndParents(indexPath.getDirName().c_str());

		{
			std::ofstream indexOut(indexPath.getPath(), std::ios_base::binary);

			if (!indexOut.is_open() || !indexOut.good())
				throw tcu::InternalError(string("Failed to open program binary index file ") + indexPath.getPath());

			indexOut.write((const char*)&index[0], index.size()*sizeof(BinaryIndexNode));
		}
	}
}